

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::vector(vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         *this,size_t count,
        polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *alloc)

{
  aligned_storage_t<sizeof(std::pair<int,_std::__cxx11::basic_string<char>_>),_alignof(std::pair<int,_std::__cxx11::basic_string<char>_>)>
  aStack_38;
  undefined8 uStack_10;
  
  aStack_38._32_8_ = 0;
  uStack_10 = 0;
  aStack_38.__align = (anon_struct_8_0_00000001_for___align)0x0;
  aStack_38._8_8_ = 0;
  aStack_38._16_8_ = 0;
  aStack_38._24_8_ = 0;
  vector(this,count,
         (optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&aStack_38.__align,alloc);
  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~optional((optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&aStack_38.__align);
  return;
}

Assistant:

vector(size_t count, const Allocator &alloc = {}) : vector(count, T{}, alloc) {}